

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O2

_Bool effect_handler_BOLT_AWARE(effect_handler_context_t *context)

{
  _Bool _Var1;
  wchar_t dam;
  source origin;
  
  dam = effect_calculate_value((effect_handler_context_t_conflict *)context,true);
  origin._4_4_ = 0;
  origin.what = (context->origin).what;
  origin.which.trap = (context->origin).which.trap;
  _Var1 = project_aimed(origin,context->subtype,context->dir,dam,(uint)context->aware << 8 | 0x48,
                        context->obj);
  if (_Var1) {
    context->ident = true;
  }
  return true;
}

Assistant:

bool effect_handler_BOLT_AWARE(effect_handler_context_t *context)
{
	int dam = effect_calculate_value(context, true);
	int flg = PROJECT_STOP | PROJECT_KILL;
	if (context->aware) flg |= PROJECT_AWARE;
	if (project_aimed(context->origin, context->subtype, context->dir, dam, flg, context->obj))
		context->ident = true;
	return true;
}